

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O1

bool __thiscall
draco::MeshAttributeCornerTable::InitFromAttribute
          (MeshAttributeCornerTable *this,Mesh *mesh,CornerTable *table,PointAttribute *att)

{
  ulong *puVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  difference_type __n_1;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar5;
  int iVar6;
  difference_type __n;
  ulong uVar7;
  int iVar8;
  _Bit_type *p_Var9;
  uint uVar10;
  CornerTable *pCVar11;
  uint uVar12;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar13;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar14;
  int iVar15;
  ulong uVar16;
  
  bVar3 = InitEmpty(this,table);
  if (bVar3) {
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCache(&this->valence_cache_);
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCacheInaccurate
              (&this->valence_cache_);
    pCVar11 = this->corner_table_;
    if ((int)((ulong)((long)(pCVar11->corner_to_vertex_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pCVar11->corner_to_vertex_map_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) != 0) {
      uVar7 = 0;
      do {
        iVar6 = (int)uVar7;
        bVar4 = CornerTable::IsDegenerated(pCVar11,(FaceIndex)(uint)((uVar7 & 0xffffffff) / 3));
        if (!bVar4) {
          pCVar11 = this->corner_table_;
          uVar10 = (pCVar11->opposite_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
          if ((ulong)uVar10 == 0xffffffff) {
            puVar1 = (ulong *)((long)(this->is_edge_on_seam_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              + (uVar7 >> 6) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
            uVar10 = iVar6 - 2;
            if (0x55555555 < (iVar6 + 1U) * -0x55555555) {
              uVar10 = iVar6 + 1U;
            }
            IVar5.value_ = 0xffffffff;
            if (uVar10 != 0xffffffff) {
              IVar5.value_ = (pCVar11->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
            }
            p_Var9 = (this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            p_Var9[IVar5.value_ >> 6] =
                 p_Var9[IVar5.value_ >> 6] | 1L << ((byte)IVar5.value_ & 0x3f);
            uVar10 = (((uint)(iVar6 * -0x55555555) < 0x55555556) - 1 | 2) + iVar6;
LAB_0014a86d:
            IVar5.value_ = 0xffffffff;
            if (uVar10 != 0xffffffff) {
              IVar5.value_ = (pCVar11->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].value_;
            }
            p_Var9[IVar5.value_ >> 6] =
                 p_Var9[IVar5.value_ >> 6] | 1L << ((byte)IVar5.value_ & 0x3f);
          }
          else if (uVar7 <= uVar10) {
            iVar8 = 1;
            uVar16 = uVar7 & 0xffffffff;
            uVar12 = uVar10;
            do {
              iVar15 = (int)uVar16;
              if (iVar15 != -1) {
                uVar16 = (ulong)(iVar15 - 2);
                if (0x55555555 < (iVar15 + 1U) * -0x55555555) {
                  uVar16 = (ulong)(iVar15 + 1U);
                }
              }
              if (uVar12 != 0xffffffff) {
                uVar12 = uVar12 + ((uVar12 * -0x55555555 < 0x55555556) - 1 | 2);
              }
              IVar13.value_ = 0xffffffff;
              IVar14.value_ = 0xffffffff;
              if (-1 < (int)uVar16) {
                IVar14.value_ =
                     (mesh->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16 / 3]._M_elems
                     [(uint)((int)uVar16 + (int)(uVar16 / 3) * -3)].value_;
              }
              if (-1 < (int)uVar12) {
                IVar13.value_ =
                     (mesh->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar12 / 3]._M_elems
                     [uVar12 % 3].value_;
              }
              if (att->identity_mapping_ == false) {
                IVar14.value_ =
                     (att->indices_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[IVar14.value_].value_;
                IVar13.value_ =
                     (att->indices_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[IVar13.value_].value_;
              }
              if (IVar14.value_ != IVar13.value_) {
                this->no_interior_seams_ = false;
                lVar2 = (long)(this->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              _M_p;
                puVar1 = (ulong *)(lVar2 + (uVar7 >> 6) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)uVar7 & 0x3f);
                puVar1 = (ulong *)(lVar2 + (ulong)(uVar10 >> 6) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)uVar10 & 0x3f);
                uVar12 = iVar6 - 2;
                if (0x55555555 < (iVar6 + 1U) * -0x55555555) {
                  uVar12 = iVar6 + 1U;
                }
                IVar5.value_ = 0xffffffff;
                if (uVar12 != 0xffffffff) {
                  IVar5.value_ = (pCVar11->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12].value_;
                }
                p_Var9 = (this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                p_Var9[IVar5.value_ >> 6] =
                     p_Var9[IVar5.value_ >> 6] | 1L << ((byte)IVar5.value_ & 0x3f);
                uVar12 = (((uint)(iVar6 * -0x55555555) < 0x55555556) - 1 | 2) + iVar6;
                IVar5.value_ = 0xffffffff;
                if (uVar12 != 0xffffffff) {
                  IVar5.value_ = (pCVar11->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12].value_;
                }
                p_Var9[IVar5.value_ >> 6] =
                     p_Var9[IVar5.value_ >> 6] | 1L << ((byte)IVar5.value_ & 0x3f);
                uVar12 = uVar10 - 2;
                if (0x55555555 < (uVar10 + 1) * -0x55555555) {
                  uVar12 = uVar10 + 1;
                }
                IVar5.value_ = 0xffffffff;
                if (uVar12 != 0xffffffff) {
                  IVar5.value_ = (pCVar11->corner_to_vertex_map_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12].value_;
                }
                p_Var9[IVar5.value_ >> 6] =
                     p_Var9[IVar5.value_ >> 6] | 1L << ((byte)IVar5.value_ & 0x3f);
                uVar10 = ((uVar10 * -0x55555555 < 0x55555556) - 1 | 2) + uVar10;
                goto LAB_0014a86d;
              }
              iVar8 = iVar8 + -1;
            } while (iVar8 == 0);
          }
        }
        pCVar11 = this->corner_table_;
        uVar7 = uVar7 + 1;
      } while (uVar7 < ((ulong)((long)(pCVar11->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar11->corner_to_vertex_map_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff));
    }
    RecomputeVertices(this,mesh,att);
  }
  return bVar3;
}

Assistant:

bool MeshAttributeCornerTable::InitFromAttribute(const Mesh *mesh,
                                                 const CornerTable *table,
                                                 const PointAttribute *att) {
  if (!InitEmpty(table)) {
    return false;
  }
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();

  // Find all necessary data for encoding attributes. For now we check which of
  // the mesh vertices is part of an attribute seam, because seams require
  // special handling.
  for (CornerIndex c(0); c < corner_table_->num_corners(); ++c) {
    const FaceIndex f = corner_table_->Face(c);
    if (corner_table_->IsDegenerated(f)) {
      continue;  // Ignore corners on degenerated faces.
    }
    const CornerIndex opp_corner = corner_table_->Opposite(c);
    if (opp_corner == kInvalidCornerIndex) {
      // Boundary. Mark it as seam edge.
      is_edge_on_seam_[c.value()] = true;
      // Mark seam vertices.
      VertexIndex v;
      v = corner_table_->Vertex(corner_table_->Next(c));
      is_vertex_on_seam_[v.value()] = true;
      v = corner_table_->Vertex(corner_table_->Previous(c));
      is_vertex_on_seam_[v.value()] = true;
      continue;
    }
    if (opp_corner < c) {
      continue;  // Opposite corner was already processed.
    }

    CornerIndex act_c(c), act_sibling_c(opp_corner);
    for (int i = 0; i < 2; ++i) {
      // Get the sibling corners. I.e., the two corners attached to the same
      // vertex but divided by the seam edge.
      act_c = corner_table_->Next(act_c);
      act_sibling_c = corner_table_->Previous(act_sibling_c);
      const PointIndex point_id = mesh->CornerToPointId(act_c.value());
      const PointIndex sibling_point_id =
          mesh->CornerToPointId(act_sibling_c.value());
      if (att->mapped_index(point_id) != att->mapped_index(sibling_point_id)) {
        no_interior_seams_ = false;
        is_edge_on_seam_[c.value()] = true;
        is_edge_on_seam_[opp_corner.value()] = true;
        // Mark seam vertices.
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Next(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_
            [corner_table_->Vertex(corner_table_->Next(opp_corner)).value()] =
                true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(opp_corner))
                               .value()] = true;
        break;
      }
    }
  }
  RecomputeVertices(mesh, att);
  return true;
}